

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

Hop_Obj_t * Hop_Permute(Hop_Man_t *p,Hop_Obj_t *pRoot,int nRootVars,int *pPermute)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  undefined8 *puVar4;
  int local_3c;
  int i;
  Hop_Obj_t *pObj;
  int *pPermute_local;
  int nRootVars_local;
  Hop_Obj_t *pRoot_local;
  Hop_Man_t *p_local;
  
  pHVar3 = Hop_Regular(pRoot);
  iVar1 = Hop_ObjIsConst1(pHVar3);
  p_local = (Hop_Man_t *)pRoot;
  if (iVar1 == 0) {
    for (local_3c = 0;
        (iVar1 = Vec_PtrSize(p->vPis), local_3c < iVar1 &&
        (puVar4 = (undefined8 *)Vec_PtrEntry(p->vPis,local_3c), local_3c != nRootVars));
        local_3c = local_3c + 1) {
      if ((pPermute[local_3c] < 0) ||
         (iVar1 = pPermute[local_3c], iVar2 = Hop_ManPiNum(p), iVar2 <= iVar1)) {
        __assert_fail("pPermute[i] >= 0 && pPermute[i] < Hop_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                      ,0x23f,"Hop_Obj_t *Hop_Permute(Hop_Man_t *, Hop_Obj_t *, int, int *)");
      }
      pHVar3 = Hop_IthVar(p,pPermute[local_3c]);
      *puVar4 = pHVar3;
    }
    pHVar3 = Hop_Regular(pRoot);
    Hop_Remap_rec(p,pHVar3);
    pHVar3 = Hop_Regular(pRoot);
    Hop_ConeUnmark_rec(pHVar3);
    pHVar3 = Hop_Regular(pRoot);
    pHVar3 = (Hop_Obj_t *)(pHVar3->field_0).pData;
    iVar1 = Hop_IsComplement(pRoot);
    p_local = (Hop_Man_t *)Hop_NotCond(pHVar3,iVar1);
  }
  return (Hop_Obj_t *)p_local;
}

Assistant:

Hop_Obj_t * Hop_Permute( Hop_Man_t * p, Hop_Obj_t * pRoot, int nRootVars, int * pPermute )
{
    Hop_Obj_t * pObj;
    int i;
    // return if constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return pRoot;
    // create mapping
    Hop_ManForEachPi( p, pObj, i )
    {
        if ( i == nRootVars )
            break;
        assert( pPermute[i] >= 0 && pPermute[i] < Hop_ManPiNum(p) );
        pObj->pData = Hop_IthVar( p, pPermute[i] );
    }
    // recursively perform composition
    Hop_Remap_rec( p, Hop_Regular(pRoot) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}